

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.hpp
# Opt level: O3

void __thiscall
libtorrent::aux::http_stream::
connected<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (http_stream *this,error_code *e,
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  size_type sVar5;
  pointer pcVar6;
  bool bVar7;
  code *UNRECOVERED_JUMPTABLE;
  long *plVar8;
  size_type *psVar9;
  endpoint *ep;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string endpoint;
  undefined1 local_100 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  bVar7 = proxy_base::
          handle_error<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
                    (&this->super_proxy_base,e,h);
  if (!bVar7) {
    if (this->m_no_connect == true) {
      pcVar3 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar4 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pcVar3 != (pointer)0x0) {
        operator_delete(pcVar3,(long)pcVar4 - (long)pcVar3);
      }
      UNRECOVERED_JUMPTABLE = (code *)h->_M_f;
      plVar8 = (long *)((long)&((h->_M_bound_args).
                                super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
                                .
                                super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>
                                ._M_head_impl.
                                super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_http_connection + *(long *)&h->field_0x8);
      if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
        UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar8 + -1);
      }
      (*UNRECOVERED_JUMPTABLE)(plVar8,e);
      return;
    }
    local_d8.container = &this->m_buffer;
    print_endpoint_abi_cxx11_(&local_50,(aux *)&(this->super_proxy_base).m_remote_endpoint,ep);
    ::std::operator+(&local_d0,"CONNECT ",&local_50);
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_d0);
    pcVar1 = local_100 + 0x10;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar9) {
      local_100._16_8_ = *psVar9;
      local_100._24_8_ = plVar8[3];
      local_100._0_8_ = pcVar1;
    }
    else {
      local_100._16_8_ = *psVar9;
      local_100._0_8_ = (size_type *)*plVar8;
    }
    local_100._8_8_ = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((string *)local_100,&local_d8);
    if ((pointer)local_100._0_8_ != pcVar1) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    paVar2 = &local_d0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    sVar5 = (this->m_user)._M_string_length;
    if (sVar5 != 0) {
      pcVar6 = (this->m_user)._M_dataplus._M_p;
      local_b0[0] = local_a0;
      ::std::__cxx11::string::_M_construct<char*>((string *)local_b0,pcVar6,pcVar6 + sVar5);
      ::std::__cxx11::string::append((char *)local_b0);
      plVar8 = (long *)::std::__cxx11::string::_M_append
                                 ((char *)local_b0,(ulong)(this->m_password)._M_dataplus._M_p);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_90.field_2._M_allocated_capacity = *psVar9;
        local_90.field_2._8_8_ = plVar8[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar9;
        local_90._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_90._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      base64encode(&local_70,&local_90);
      plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3efe3b);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_d0.field_2._M_allocated_capacity = *psVar9;
        local_d0.field_2._8_8_ = plVar8[3];
        local_d0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar9;
        local_d0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_d0);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar9) {
        local_100._16_8_ = *psVar9;
        local_100._24_8_ = plVar8[3];
        local_100._0_8_ = pcVar1;
      }
      else {
        local_100._16_8_ = *psVar9;
        local_100._0_8_ = (size_type *)*plVar8;
      }
      local_100._8_8_ = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((string *)local_100,&local_d8);
      if ((pointer)local_100._0_8_ != pcVar1) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
    }
    local_100._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"\r\n","");
    write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((string *)local_100,&local_d8);
    if ((pointer)local_100._0_8_ != pcVar1) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    pcVar3 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_d0._M_string_length =
         (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pcVar3;
    local_d0._M_dataplus._M_p = (pointer)0x0;
    if (local_d0._M_string_length != 0) {
      local_d0._M_dataplus._M_p = pcVar3;
    }
    local_100._24_8_ =
         (h->_M_bound_args).
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
         _M_head_impl.
         super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Stack_e0._M_pi =
         (h->_M_bound_args).
         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
         .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
         _M_head_impl.
         super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (h->_M_bound_args).
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (h->_M_bound_args).
    super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
    super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_100._8_8_ = h->_M_f;
    local_100._16_8_ = *(undefined8 *)&h->field_0x8;
    local_100._0_8_ = this;
    local_70._M_dataplus._M_p = (pointer)this;
    boost::asio::detail::
    initiate_async_write_buffer_sequence<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>>
    ::operator()((initiate_async_write_buffer_sequence<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>>
                  *)&local_70,
                 (wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__http_stream_hpp:116:4),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
                  *)local_100,(mutable_buffer *)&local_d0,(transfer_all_t *)&local_90);
    if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void connected(error_code const& e, Handler h)
	{
		if (handle_error(e, h)) return;

		using namespace libtorrent::aux;

		if (m_no_connect)
		{
			std::vector<char>().swap(m_buffer);
			std::move(h)(e);
			return;
		}

		// send CONNECT
		std::back_insert_iterator<std::vector<char>> p(m_buffer);
		std::string const endpoint = print_endpoint(m_remote_endpoint);
		write_string("CONNECT " + endpoint + " HTTP/1.0\r\n", p);
		if (!m_user.empty())
		{
			write_string("Proxy-Authorization: Basic " + base64encode(
				m_user + ":" + m_password) + "\r\n", p);
		}
		write_string("\r\n", p);
		async_write(m_sock, boost::asio::buffer(m_buffer), wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				handshake1(ec, std::move(hn));
			}, std::move(h)));
	}